

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void Assimp::FBX::ParseVectorDataArray
               (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *out,Element *el)

{
  pointer *ppaVar1;
  Token *t;
  pointer ppTVar2;
  iterator __position;
  char *end;
  undefined1 auVar3 [8];
  size_t __n;
  Scope *sc;
  Element *pEVar4;
  Element *in_R9;
  aiVector2t<float> aVar5;
  pointer ppTVar6;
  long lVar7;
  uint uVar8;
  ulong __n_00;
  float fVar9;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  byte local_69;
  undefined1 local_68 [8];
  pointer pcStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  aiVector2t<float> local_48;
  char *local_40;
  uint local_34;
  
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize(out,0);
  ppTVar6 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar6 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_68 = (undefined1  [8])&local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"unexpected empty element","");
    anon_unknown.dwarf_1284bda::ParseError((string *)local_68,el);
  }
  t = *ppTVar6;
  if (t->column == 0xffffffff) {
    local_40 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_40,end,(char *)&local_69,&local_34,el);
    if ((local_34 & 1) != 0) {
      local_68 = (undefined1  [8])&local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"number of floats is not a multiple of two (2) (binary)","");
      anon_unknown.dwarf_1284bda::ParseError((string *)local_68,el);
    }
    if (local_34 != 0) {
      if ((local_69 & 0xfd) != 100) {
        local_68 = (undefined1  [8])&local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"expected float or double array (binary)","");
        anon_unknown.dwarf_1284bda::ParseError((string *)local_68,el);
      }
      local_68._0_4_ = 0.0;
      local_68._4_4_ = 0.0;
      pcStack_60 = (pointer)0x0;
      local_58._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                (local_69,local_34,&local_40,end,(vector<char,_std::allocator<char>_> *)local_68,
                 in_R9);
      __n_00 = (ulong)(local_34 >> 1);
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve(out,__n_00);
      auVar3 = local_68;
      if (local_69 == 0x66) {
        lVar7 = 0;
        do {
          local_48 = *(aiVector2t<float> *)((long)auVar3 + lVar7 * 8);
          std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
          emplace_back<aiVector2t<float>>
                    ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)out,&local_48);
          lVar7 = lVar7 + 1;
        } while (local_34 >> 1 != (uint)lVar7);
      }
      else if (local_69 == 100) {
        aVar5 = (aiVector2t<float>)local_68;
        do {
          local_48.y = (float)*(double *)((long)aVar5 + 8);
          local_48.x = (float)*(double *)aVar5;
          std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
          emplace_back<aiVector2t<float>>
                    ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)out,&local_48);
          aVar5 = (aiVector2t<float>)((long)aVar5 + 0x10);
          uVar8 = (int)__n_00 - 1;
          __n_00 = (ulong)uVar8;
        } while (uVar8 != 0);
      }
      if ((aiVector2t<float>)local_68 != (aiVector2t<float>)0x0) {
        operator_delete((void *)local_68,local_58._M_allocated_capacity - (long)local_68);
      }
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    local_68 = (undefined1  [8])&local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a","");
    pEVar4 = GetRequiredElement(sc,(string *)local_68,el);
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
    }
    ppTVar6 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (((int)ppTVar2 - (int)ppTVar6 & 8U) != 0) {
      local_68 = (undefined1  [8])&local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"number of floats is not a multiple of two (2)","");
      anon_unknown.dwarf_1284bda::ParseError((string *)local_68,el);
    }
    if (ppTVar6 != ppTVar2) {
      do {
        local_68._0_4_ = 0.0;
        local_68._4_4_ = 0.0;
        fVar9 = ParseTokenAsFloat(*ppTVar6);
        local_68._0_4_ = fVar9;
        fVar9 = ParseTokenAsFloat(ppTVar6[1]);
        local_68._4_4_ = fVar9;
        __position._M_current =
             (out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
          _M_realloc_insert<aiVector2t<float>const&>
                    ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)out,__position,
                     (aiVector2t<float> *)local_68);
        }
        else {
          (__position._M_current)->x = (float)local_68._0_4_;
          (__position._M_current)->y = fVar9;
          ppaVar1 = &(out->
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        ppTVar6 = ppTVar6 + 2;
      } while (ppTVar6 != ppTVar2);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<aiVector2D>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(count % 2 != 0) {
            ParseError("number of floats is not a multiple of two (2) (binary)",&el);
        }

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        const uint32_t count2 = count / 2;
        out.reserve(count2);

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count2; ++i, d += 2) {
                out.push_back(aiVector2D(static_cast<float>(d[0]),
                    static_cast<float>(d[1])));
            }
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count2; ++i, f += 2) {
                out.push_back(aiVector2D(f[0],f[1]));
            }
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray() above
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    if (a.Tokens().size() % 2 != 0) {
        ParseError("number of floats is not a multiple of two (2)",&el);
    }
    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        aiVector2D v;
        v.x = ParseTokenAsFloat(**it++);
        v.y = ParseTokenAsFloat(**it++);

        out.push_back(v);
    }
}